

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O1

void __thiscall mocker::LoopInvariantCodeMotion::insertPreHeaders(LoopInvariantCodeMotion *this)

{
  pointer puVar1;
  FunctionModule *this_00;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *ppVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  mapped_type *pmVar8;
  BasicBlock *pBVar9;
  BBLIter BVar10;
  BasicBlock *pBVar11;
  __node_base_ptr p_Var12;
  _func_int **pp_Var13;
  __hash_code __code;
  __node_base _Var14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  element_type *peVar16;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
  *this_02;
  __node_base_ptr p_Var17;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *__args;
  pointer pbVar18;
  pointer pbVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer ppVar20;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar21;
  unsigned_long header;
  pair<std::shared_ptr<mocker::ir::Phi>,_std::shared_ptr<mocker::ir::Phi>_> newPhis;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  optionMoved;
  shared_ptr<mocker::ir::Reg> preHeaderPhiDest;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  optionLeft;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  outerPreds;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  Preds;
  undefined1 local_199;
  shared_ptr<mocker::ir::Label> local_198;
  Phi local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  local_138;
  shared_ptr<mocker::ir::IRInst> local_120;
  shared_ptr<mocker::ir::IRInst> local_110;
  shared_ptr<mocker::ir::Reg> local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  pointer local_e0;
  pointer local_d8;
  FunctionModule *local_d0;
  pointer local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  size_t local_b8 [3];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  buildBlockPredecessors
            ((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&local_68,(this->super_FuncPass).func);
  pbVar18 = (pointer)(this->loopTree).loops._M_h._M_before_begin._M_nxt;
  if (pbVar18 != (pointer)0x0) {
    local_f0._M_allocated_capacity = (size_type)&this->preHeaders;
    do {
      local_188.super_Definition._vptr_Definition = (_func_int **)pbVar18->_M_string_length;
      if (pbVar18[1]._M_string_length != 1) {
        pmVar8 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&local_68,(key_type *)&local_188.super_Definition);
        puVar1 = (pmVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pmVar8 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&local_68,(key_type *)&local_188.super_Definition);
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _Hashtable<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_a0,puVar1,
                   (pmVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish,0,&local_198,&local_188.options,
                   (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                    *)local_b8);
        subSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
                  ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&local_a0,
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&pbVar18->field_2);
        this_00 = (this->super_FuncPass).func;
        if ((_List_node_base *)pbVar18->_M_string_length !=
            (this_00->bbs).
            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
            _M_impl._M_node.super__List_node_base._M_next[1]._M_next) {
          if ((_Hash_node_base *)local_a0._M_element_count == (_Hash_node_base *)0x0) {
            __assert_fail("!outerPreds.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp"
                          ,0x3c,"void mocker::LoopInvariantCodeMotion::insertPreHeaders()");
          }
          pBVar9 = ir::FunctionModule::getMutableBasicBlock
                             (this_00,(size_t)local_188.super_Definition._vptr_Definition);
          BVar10 = ir::FunctionModule::pushBackBB((this->super_FuncPass).func);
          local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BVar10._M_node[1]._M_next;
          local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_188.super_Definition._vptr_Definition;
          local_140 = local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
          pVar21 = std::
                   _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   ::_M_emplace<std::pair<unsigned_long,unsigned_long>>
                             ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                               *)local_f0._M_allocated_capacity,&local_198);
          _Var14._M_nxt = local_a0._M_before_begin._M_nxt;
          local_188.super_Definition.dest.
          super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BVar10;
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            __assert_fail("tmp",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp"
                          ,0x43,"void mocker::LoopInvariantCodeMotion::insertPreHeaders()");
          }
          for (; _Var14._M_nxt != (_Hash_node_base *)0x0; _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt) {
            pBVar11 = ir::FunctionModule::getMutableBasicBlock
                                ((this->super_FuncPass).func,(size_t)_Var14._M_nxt[1]._M_nxt);
            p_Var2 = (pBVar11->insts).
                     super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                     ._M_impl._M_node.super__List_node_base._M_prev;
            replaceTerminatorLabel
                      ((mocker *)&local_198,(shared_ptr<mocker::ir::IRInst> *)(p_Var2 + 1),
                       (size_t)local_188.super_Definition._vptr_Definition,(size_t)local_140);
            _Var15._M_pi = local_198.
                           super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
            peVar7 = local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[1]._M_prev;
            p_Var2[1]._M_next = (_List_node_base *)peVar7;
            p_Var2[1]._M_prev = (_List_node_base *)_Var15._M_pi;
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
            if (local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          local_188.super_Definition.dest.
          super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_188.super_Definition.dest.
               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
          ;
          local_d8 = (pointer)&pBVar9->insts;
          pbVar19 = (pointer)(pBVar9->insts).
                             super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next;
          local_f0._8_8_ = pBVar9;
          local_e0 = pbVar18;
          if (pbVar19 != local_d8) {
            do {
              ppVar20 = (pointer)(pbVar19->field_2)._M_allocated_capacity;
              if (*(int *)&(ppVar20->first).
                           super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi == 0xf) {
                peVar16 = *(element_type **)((long)&pbVar19->field_2 + 8);
                if (peVar16 != (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&(peVar16->identifier)._M_dataplus._M_p =
                         *(int *)&(peVar16->identifier)._M_dataplus._M_p + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&(peVar16->identifier)._M_dataplus._M_p =
                         *(int *)&(peVar16->identifier)._M_dataplus._M_p + 1;
                  }
                }
              }
              else {
                ppVar20 = (pointer)0x0;
                peVar16 = (element_type *)0x0;
              }
              if (ppVar20 == (pointer)0x0) {
                if (peVar16 != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar16);
                }
                break;
              }
              local_d0 = (this->super_FuncPass).func;
              local_b8[2] = 0;
              local_b8[0] = 0;
              local_b8[1] = 0;
              local_138.
              super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_138.
              super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_138.
              super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ppVar3 = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                        *)ppVar20[1].second.
                          super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_188.super_Definition.dest.
              super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar16;
              for (__args = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                             *)ppVar20[1].first.
                               super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi; __args != ppVar3; __args = __args + 1) {
                p_Var4 = (_Hash_node_base *)
                         ((__args->second).
                          super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->id;
                p_Var5 = local_a0._M_buckets[(ulong)p_Var4 % local_a0._M_bucket_count];
                p_Var12 = (__node_base_ptr)0x0;
                if ((p_Var5 != (__node_base_ptr)0x0) &&
                   (p_Var12 = p_Var5, p_Var17 = p_Var5->_M_nxt, p_Var4 != p_Var5->_M_nxt[1]._M_nxt))
                {
                  while (p_Var6 = p_Var17->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
                    p_Var12 = (__node_base_ptr)0x0;
                    if (((ulong)p_Var6[1]._M_nxt % local_a0._M_bucket_count !=
                         (ulong)p_Var4 % local_a0._M_bucket_count) ||
                       (p_Var12 = p_Var17, p_Var17 = p_Var6, p_Var4 == p_Var6[1]._M_nxt))
                    goto LAB_00111d11;
                  }
                  p_Var12 = (__node_base_ptr)0x0;
                }
LAB_00111d11:
                this_02 = (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                           *)local_b8;
                if ((p_Var12 != (__node_base_ptr)0x0) &&
                   (this_02 = (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                               *)&local_138, p_Var12->_M_nxt == (_Hash_node_base *)0x0)) {
                  this_02 = (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                             *)local_b8;
                }
                std::
                vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                ::
                emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>const&>
                          (this_02,__args);
              }
              if (local_138.
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_138.
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                local_188.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)local_188.super_Definition.dest.
                              super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ;
                if (local_188.super_Definition.dest.
                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&((local_188.super_Definition.dest.
                               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->identifier)._M_dataplus._M_p =
                         *(int *)&((local_188.super_Definition.dest.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->identifier)._M_dataplus._M_p + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&((local_188.super_Definition.dest.
                               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->identifier)._M_dataplus._M_p =
                         *(int *)&((local_188.super_Definition.dest.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->identifier)._M_dataplus._M_p + 1;
                  }
                }
                local_188.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                p_Stack_148 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                _Var15._M_pi = local_188.super_Definition.dest.
                               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                local_188.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = ppVar20;
              }
              else {
                local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_188.super_IRInst._vptr_IRInst._0_1_ = 0;
                local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_188;
                ir::FunctionModule::makeTempLocalReg
                          ((FunctionModule *)&local_100,&local_d0->identifier);
                if ((Phi *)local_198.
                           super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != &local_188) {
                  operator_delete(local_198.
                                  super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,CONCAT71(local_188.super_IRInst._vptr_IRInst._1_7_,
                                                  local_188.super_IRInst._vptr_IRInst._0_1_) + 1);
                }
                local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
                (local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count = 1;
                (local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count = 1;
                (local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base =
                     (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
                local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     (local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 1);
                local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 &local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[1]._M_use_count = local_140;
                std::
                vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                ::emplace_back<std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Label>>
                          ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                            *)local_b8,&local_100,&local_198);
                if (local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_198.
                             super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_198.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::ir::Phi,std::allocator<mocker::ir::Phi>,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>&>
                          (&local_198.
                            super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Phi **)&local_198,(allocator<mocker::ir::Phi> *)&local_c8,
                           (shared_ptr<mocker::ir::Reg> *)
                           &(ppVar20->second).
                            super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                            *)local_b8);
                local_c8 = (pointer)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::ir::Phi,std::allocator<mocker::ir::Phi>,std::shared_ptr<mocker::ir::Reg>&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>&>
                          (&_Stack_c0,(Phi **)&local_c8,(allocator<mocker::ir::Phi> *)&local_199,
                           &local_100,&local_138);
                _Var15._M_pi = local_188.super_Definition.dest.
                               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                local_188.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)local_198.
                              super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                local_188.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)local_198.
                              super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                local_188.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
                p_Stack_148 = _Stack_c0._M_pi;
                if (local_100.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_100.
                             super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
              }
              std::
              vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
              ::~vector(&local_138);
              std::
              vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
              ::~vector((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                         *)local_b8);
              if (local_188.options.
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                local_110.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)
                       local_188.options.
                       super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_110.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = p_Stack_148;
                if (p_Stack_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Stack_148->_M_use_count = p_Stack_148->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Stack_148->_M_use_count = p_Stack_148->_M_use_count + 1;
                  }
                }
                ir::BasicBlock::appendInst((BasicBlock *)_Var15._M_pi,&local_110);
                if (local_110.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_110.
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                (pbVar19->field_2)._M_allocated_capacity =
                     (size_type)
                     local_188.options.
                     super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&pbVar19->field_2 + 8),
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &local_188.options.
                            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
              }
              if (p_Stack_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_148);
              }
              peVar16 = local_188.super_Definition.dest.
                        super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if ((element_type *)
                  local_188.options.
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_188.options.
                           super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              if (peVar16 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar16);
              }
              pbVar19 = (pointer)(pbVar19->_M_dataplus)._M_p;
            } while (pbVar19 != local_d8);
          }
          pp_Var13 = (_func_int **)operator_new(0x20);
          pp_Var13[1] = (_func_int *)0x100000001;
          *pp_Var13 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001efa00;
          pp_Var13[2] = (_func_int *)&PTR__Addr_001efab0;
          pp_Var13[3] = (_func_int *)local_188.super_Definition._vptr_Definition;
          local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          pbVar18 = local_e0;
          _Var15._M_pi = local_188.super_Definition.dest.
                         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi;
          (local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count = 1;
          (local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_weak_count = 1;
          (local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efc20;
          local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 1);
          local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._M_use_count = 0xc;
          local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001efc70;
          local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[2]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001efc90;
          *(_func_int ***)
           &local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi[2]._M_use_count = pp_Var13 + 2;
          local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[3]._vptr__Sp_counted_base = pp_Var13;
          ir::BasicBlock::appendInst
                    ((BasicBlock *)
                     local_188.super_Definition.dest.
                     super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi,&local_120);
          if (local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_120.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          simplifyPhiFunctions((BasicBlock *)local_f0._8_8_);
          simplifyPhiFunctions((BasicBlock *)_Var15._M_pi);
        }
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_a0);
      }
      pbVar18 = (pointer)(pbVar18->_M_dataplus)._M_p;
    } while (pbVar18 != (pointer)0x0);
  }
  removeDeletedInsts((this->super_FuncPass).func);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void LoopInvariantCodeMotion::insertPreHeaders() {
  const auto Preds = buildBlockPredecessors(func);

  for (auto &kv : loopTree.getLoops()) {
    auto header = kv.first;
    auto &loopNodes = kv.second;
    if (loopNodes.size() == 1) // is not a loop header
      continue;
    std::unordered_set<std::size_t> outerPreds(Preds.at(header).begin(),
                                               Preds.at(header).end());
    subSet(outerPreds, loopNodes);

    if (kv.first == func.getFirstBBLabel())
      continue;

    assert(!outerPreds.empty());

    // Insert a pre-header. Be careful with the phi-functions
    auto &headBB = func.getMutableBasicBlock(header);
    auto &preHeaderBB = *func.pushBackBB();
    auto preHeader = preHeaderBB.getLabelID();
    auto tmp = preHeaders.emplace(std::make_pair(header, preHeader)).second;
    assert(tmp);

    // adjust the terminators of the outer predecessors
    for (auto &pred : outerPreds) {
      auto &bb = func.getMutableBasicBlock(pred);
      auto &terminator = bb.getMutableInsts().back();
      terminator = replaceTerminatorLabel(terminator, header, preHeader);
    }

    // adjust the phi-functions
    for (auto &inst : headBB.getMutableInsts()) {
      const auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      auto newPhis = splitPhi(func, phi, outerPreds, preHeader);
      if (newPhis.second) {
        preHeaderBB.appendInst(newPhis.second);
        inst = newPhis.first;
      }
    }
    preHeaderBB.appendInst(
        std::make_shared<ir::Jump>(std::make_shared<ir::Label>(header)));
    simplifyPhiFunctions(headBB);
    simplifyPhiFunctions(preHeaderBB);
  }
  removeDeletedInsts(func);
}